

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

range_type * __thiscall
cppcms::impl::details::
basic_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>
::get<std::__cxx11::string>
          (basic_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  
  uVar2 = 0;
  if (k->_M_string_length != 0) {
    sVar3 = 0;
    do {
      uVar1 = (int)uVar2 * 0x10 + (uint)(byte)(k->_M_dataplus)._M_p[sVar3];
      uVar1 = uVar1 & 0xfffffff ^ uVar1 >> 0x18 & 0xfffffff0;
      uVar2 = (ulong)uVar1;
      sVar3 = sVar3 + 1;
    } while (k->_M_string_length != sVar3);
    uVar2 = (ulong)uVar1;
  }
  return (range_type *)
         (*(long *)this +
         (ulong)(uint)((int)(uVar2 % (ulong)(*(long *)(this + 8) - *(long *)this >> 4)) << 4));
}

Assistant:

range_type &get(Kt const &k)
	{
		Hash hf;
		size_t h = hf(k) % hash_.size();
		return hash_[h];
	}